

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int __kmp_api_omp_get_thread_limit_(void)

{
  int iVar1;
  
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  iVar1 = __kmp_get_global_thread_id_reg();
  return (((__kmp_threads[iVar1]->th).th_current_task)->td_icvs).thread_limit;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_THREAD_LIMIT)(void) {
#ifdef KMP_STUB
  return 1; // TO DO: clarify whether it returns 1 or 0?
#else
  int gtid;
  kmp_info_t *thread;
  if (!__kmp_init_serial) {
    __kmp_serial_initialize();
  }

  gtid = __kmp_entry_gtid();
  thread = __kmp_threads[gtid];
  return thread->th.th_current_task->td_icvs.thread_limit;
#endif
}